

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_init_stdfile
               (mpack_tree_t *tree,FILE *stdfile,size_t max_bytes,_Bool close_when_done)

{
  _Bool _Var1;
  _Bool close_when_done_local;
  size_t max_bytes_local;
  FILE *stdfile_local;
  mpack_tree_t *tree_local;
  
  _Var1 = mpack_tree_file_check_max_bytes(tree,max_bytes);
  if ((_Var1) && (mpack_tree_init_stdfile_noclose(tree,stdfile,max_bytes), close_when_done)) {
    fclose((FILE *)stdfile);
  }
  return;
}

Assistant:

void mpack_tree_init_stdfile(mpack_tree_t* tree, FILE* stdfile, size_t max_bytes, bool close_when_done) {
    if (!mpack_tree_file_check_max_bytes(tree, max_bytes))
        return;

    mpack_tree_init_stdfile_noclose(tree, stdfile, max_bytes);

    if (close_when_done)
        fclose(stdfile);
}